

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O0

void trico_remove_duplicate_vertices
               (uint32_t *nr_of_vertices,float **vertices,uint32_t nr_of_triangles,
               uint32_t **triangles)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  float fVar4;
  int iVar5;
  float *L;
  float *pfVar6;
  float *local_70;
  float *result;
  float *last;
  float *first;
  uint32_t v2;
  uint32_t v1;
  uint32_t v0;
  uint32_t id2;
  uint32_t id1;
  uint32_t id0;
  uint32_t i;
  float *p_vert;
  float *vert;
  uint32_t **triangles_local;
  uint32_t nr_of_triangles_local;
  float **vertices_local;
  uint32_t *nr_of_vertices_local;
  
  if (nr_of_triangles != 0) {
    L = (float *)trico_malloc((ulong)(nr_of_triangles * 3) << 4);
    _id0 = L;
    for (id1 = 0; id1 < nr_of_triangles; id1 = id1 + 1) {
      fVar4 = (float)(id1 * 3);
      uVar1 = (*triangles)[(uint)fVar4];
      uVar2 = (*triangles)[(int)fVar4 + 1U];
      uVar3 = (*triangles)[(int)fVar4 + 2U];
      *_id0 = (*vertices)[uVar1 * 3];
      _id0[1] = (*vertices)[uVar1 * 3 + 1];
      _id0[2] = (*vertices)[uVar1 * 3 + 2];
      _id0[3] = fVar4;
      _id0[4] = (*vertices)[uVar2 * 3];
      _id0[5] = (*vertices)[uVar2 * 3 + 1];
      _id0[6] = (*vertices)[uVar2 * 3 + 2];
      _id0[7] = (float)((int)fVar4 + 1U);
      _id0[8] = (*vertices)[uVar3 * 3];
      _id0[9] = (*vertices)[uVar3 * 3 + 1];
      pfVar6 = _id0 + 0xb;
      _id0[10] = (*vertices)[uVar3 * 3 + 2];
      _id0 = _id0 + 0xc;
      *pfVar6 = (float)((int)fVar4 + 2U);
    }
    trico_quicksort_vertices(L,0,(ulong)(nr_of_triangles * 3 - 1));
    *nr_of_vertices = 0;
    (*vertices)[*nr_of_vertices * 3] = *L;
    (*vertices)[*nr_of_vertices * 3 + 1] = L[1];
    (*vertices)[*nr_of_vertices * 3 + 2] = L[2];
    (*triangles)[(uint)L[3]] = *nr_of_vertices;
    local_70 = L;
    last = L;
    while (last = last + 4, last != L + nr_of_triangles * 0xc) {
      iVar5 = trico_equal_vertices(local_70,last);
      if (iVar5 == 0) {
        while (pfVar6 = local_70 + 4, pfVar6 != last) {
          (*triangles)[(uint)local_70[7]] = *nr_of_vertices;
          local_70 = pfVar6;
        }
        *nr_of_vertices = *nr_of_vertices + 1;
        (*vertices)[*nr_of_vertices * 3] = *pfVar6;
        (*vertices)[*nr_of_vertices * 3 + 1] = local_70[5];
        (*vertices)[*nr_of_vertices * 3 + 2] = local_70[6];
        (*triangles)[(uint)local_70[7]] = *nr_of_vertices;
        local_70 = pfVar6;
      }
    }
    while (local_70 + 4 != last) {
      (*triangles)[(uint)local_70[7]] = *nr_of_vertices;
      local_70 = local_70 + 4;
    }
    *nr_of_vertices = *nr_of_vertices + 1;
    trico_free(L);
  }
  return;
}

Assistant:

static void trico_remove_duplicate_vertices(uint32_t* nr_of_vertices, float** vertices, uint32_t nr_of_triangles, uint32_t** triangles)
  {
  if (nr_of_triangles == 0)
    return;

  float* vert = (float*)trico_malloc(nr_of_triangles * 3 * sizeof(float) * 4);

  float* p_vert = vert;
  for (uint32_t i = 0; i < nr_of_triangles; ++i)
    {
    const uint32_t id0 = i * 3;
    const uint32_t id1 = id0 + 1;
    const uint32_t id2 = id1 + 1;
    const uint32_t v0 = (*triangles)[id0];
    const uint32_t v1 = (*triangles)[id1];
    const uint32_t v2 = (*triangles)[id2];


    *p_vert++ = (*vertices)[v0 * 3];
    *p_vert++ = (*vertices)[v0 * 3 + 1];
    *p_vert++ = (*vertices)[v0 * 3 + 2];
    *p_vert++ = *(const float*)(&id0);

    *p_vert++ = (*vertices)[v1 * 3];
    *p_vert++ = (*vertices)[v1 * 3 + 1];
    *p_vert++ = (*vertices)[v1 * 3 + 2];
    *p_vert++ = *(const float*)(&id1);

    *p_vert++ = (*vertices)[v2 * 3];
    *p_vert++ = (*vertices)[v2 * 3 + 1];
    *p_vert++ = (*vertices)[v2 * 3 + 2];
    *p_vert++ = *(const float*)(&id2);
    }

  trico_quicksort_vertices(vert, 0, (3 * nr_of_triangles) - 1);

  float* first = vert;
  float* last = vert + 3 * nr_of_triangles * 4;

  *nr_of_vertices = 0;

  float* result = first;
  (*vertices)[*nr_of_vertices * 3] = result[0];
  (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
  (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
  (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
  while ((first += 4) != last)
    {
    if (trico_equal_vertices(result, first) == 0)
      {
      while ((result += 4) != first)
        {
        (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
        }
      ++(*nr_of_vertices);
      (*vertices)[*nr_of_vertices * 3] = result[0];
      (*vertices)[*nr_of_vertices * 3 + 1] = result[1];
      (*vertices)[*nr_of_vertices * 3 + 2] = result[2];
      (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
      }
    }
  while ((result += 4) != first)
    {
    (*triangles)[*(uint32_t*)(&(result[3]))] = *nr_of_vertices;
    }
  ++(*nr_of_vertices);

  trico_free(vert);
  }